

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O0

int testSystemTools(int param_1,char **param_2)

{
  char escape_char;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string output;
  string local_78;
  allocator local_41;
  string local_40;
  int local_20;
  byte local_19;
  int cc;
  bool res;
  char **param_1_local;
  int param_0_local;
  
  local_19 = 1;
  local_20 = 0;
  _cc = param_2;
  param_1_local._4_4_ = param_1;
  while (toUnixPaths[local_20][0] != (char *)0x0) {
    pcVar1 = toUnixPaths[local_20][0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    pcVar1 = toUnixPaths[local_20][1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,pcVar1,(allocator *)(output.field_2._M_local_buf + 0xf));
    bVar3 = CheckConvertToUnixSlashes(&local_40,&local_78);
    local_19 = (local_19 & 1 & bVar3) != 0;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::string((string *)local_a0);
  bVar3 = cmsys::SystemTools::GetEnv("HOME",(string *)local_a0);
  if (bVar3) {
    std::__cxx11::string::operator+=((string *)local_a0,"/foo bar/lala");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"~/foo bar/lala",&local_c1);
    bVar3 = CheckConvertToUnixSlashes(&local_c0,(string *)local_a0);
    local_19 = (local_19 & 1 & bVar3) != 0;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  local_20 = 0;
  while (checkEscapeChars[local_20][0] != (char *)0x0) {
    pcVar1 = checkEscapeChars[local_20][0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,pcVar1,&local_e9);
    lVar4 = (long)local_20;
    pcVar1 = checkEscapeChars[lVar4][1];
    escape_char = *checkEscapeChars[lVar4][2];
    pcVar2 = checkEscapeChars[lVar4][3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,pcVar2,&local_111);
    bVar3 = CheckEscapeChars(&local_e8,pcVar1,escape_char,&local_110);
    local_19 = (local_19 & 1 & bVar3) != 0;
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_20 = local_20 + 1;
  }
  bVar3 = CheckFileOperations();
  local_19 = bVar3 & local_19;
  bVar3 = CheckStringOperations();
  local_19 = bVar3 & local_19;
  bVar3 = CheckEnvironmentOperations();
  local_19 = bVar3 & local_19;
  bVar3 = CheckRelativePaths();
  local_19 = bVar3 & local_19;
  bVar3 = CheckCollapsePath();
  local_19 = bVar3 & local_19;
  bVar3 = CheckGetPath();
  local_19 = bVar3 & local_19;
  bVar3 = CheckFind();
  local_19 = bVar3 & local_19;
  bVar3 = CheckGetLineFromStream();
  local_19 = (local_19 & 1 & bVar3) != 0;
  bVar3 = !(bool)local_19;
  std::__cxx11::string::~string((string *)local_a0);
  return (uint)bVar3;
}

Assistant:

int testSystemTools(int, char* [])
{
  bool res = true;

  int cc;
  for (cc = 0; toUnixPaths[cc][0]; cc++) {
    res &= CheckConvertToUnixSlashes(toUnixPaths[cc][0], toUnixPaths[cc][1]);
  }

  // Special check for ~
  std::string output;
  if (kwsys::SystemTools::GetEnv("HOME", output)) {
    output += "/foo bar/lala";
    res &= CheckConvertToUnixSlashes("~/foo bar/lala", output);
  }

  for (cc = 0; checkEscapeChars[cc][0]; cc++) {
    res &= CheckEscapeChars(checkEscapeChars[cc][0], checkEscapeChars[cc][1],
                            *checkEscapeChars[cc][2], checkEscapeChars[cc][3]);
  }

  res &= CheckFileOperations();

  res &= CheckStringOperations();

  res &= CheckEnvironmentOperations();

  res &= CheckRelativePaths();

  res &= CheckCollapsePath();

  res &= CheckGetPath();

  res &= CheckFind();

  res &= CheckGetLineFromStream();

  return res ? 0 : 1;
}